

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_tableref.cpp
# Opt level: O2

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::Transformer::TransformTableRefNode(Transformer *this,PGNode *n)

{
  PGNodeTag PVar1;
  NotImplementedException *this_00;
  PGNodeTag *in_RDX;
  allocator local_51;
  StackChecker<duckdb::Transformer> stack_checker;
  string local_40;
  
  StackCheck((Transformer *)&stack_checker,(idx_t)n);
  PVar1 = *in_RDX;
  if (PVar1 == T_PGRangeFunction) {
    TransformRangeFunction(this,(PGRangeFunction *)n);
  }
  else if (PVar1 == T_PGJoinExpr) {
    TransformJoin(this,(PGJoinExpr *)n);
  }
  else if (PVar1 == T_PGPivotExpr) {
    TransformPivot(this,(PGPivotExpr *)n);
  }
  else if (PVar1 == T_PGRangeSubselect) {
    TransformRangeSubselect(this,(PGRangeSubselect *)n);
  }
  else {
    if (PVar1 != T_PGRangeVar) {
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)&local_40,"From Type %d not supported",&local_51);
      NotImplementedException::NotImplementedException<duckdb_libpgquery::PGNodeTag>
                (this_00,&local_40,*in_RDX);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    TransformRangeVar(this,(PGRangeVar *)n);
  }
  (stack_checker.recursive_class)->stack_depth =
       (stack_checker.recursive_class)->stack_depth - stack_checker.stack_usage;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> Transformer::TransformTableRefNode(duckdb_libpgquery::PGNode &n) {
	auto stack_checker = StackCheck();

	switch (n.type) {
	case duckdb_libpgquery::T_PGRangeVar:
		return TransformRangeVar(PGCast<duckdb_libpgquery::PGRangeVar>(n));
	case duckdb_libpgquery::T_PGJoinExpr:
		return TransformJoin(PGCast<duckdb_libpgquery::PGJoinExpr>(n));
	case duckdb_libpgquery::T_PGRangeSubselect:
		return TransformRangeSubselect(PGCast<duckdb_libpgquery::PGRangeSubselect>(n));
	case duckdb_libpgquery::T_PGRangeFunction:
		return TransformRangeFunction(PGCast<duckdb_libpgquery::PGRangeFunction>(n));
	case duckdb_libpgquery::T_PGPivotExpr:
		return TransformPivot(PGCast<duckdb_libpgquery::PGPivotExpr>(n));
	default:
		throw NotImplementedException("From Type %d not supported", n.type);
	}
}